

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Literal * wasm::Literal::makeFromInt64(Literal *__return_storage_ptr__,int64_t x,Type type)

{
  BasicType BVar1;
  LaneArray<2> local_50;
  long local_20;
  int64_t x_local;
  Type type_local;
  
  local_20 = x;
  x_local = type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  BVar1 = wasm::Type::getBasic((Type *)&x_local);
  switch(BVar1) {
  case i32:
    Literal(__return_storage_ptr__,(int32_t)local_20);
    break;
  case i64:
    Literal(__return_storage_ptr__,local_20);
    break;
  case f32:
    Literal(__return_storage_ptr__,(float)local_20);
    break;
  case f64:
    Literal(__return_storage_ptr__,(double)local_20);
    break;
  case v128:
    Literal(local_50._M_elems,local_20);
    Literal(local_50._M_elems + 1,0);
    Literal(__return_storage_ptr__,&local_50);
    std::array<wasm::Literal,_2UL>::~array(&local_50);
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                       ,0xd4);
  }
  return __return_storage_ptr__;
}

Assistant:

static Literal makeFromInt64(int64_t x, Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(int32_t(x));
      case Type::i64:
        return Literal(int64_t(x));
      case Type::f32:
        return Literal(float(x));
      case Type::f64:
        return Literal(double(x));
      case Type::v128:
        return Literal(
          std::array<Literal, 2>{{Literal(x), Literal(int64_t(0))}});
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }